

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwt.c
# Opt level: O0

void opj_idwt53_v_cas0_mcols_SSE2_OR_AVX2
               (OPJ_INT32 *tmp,OPJ_INT32 sn,OPJ_INT32 len,OPJ_INT32 *tiledp_col,OPJ_SIZE_T stride)

{
  longlong *plVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  longlong *plVar4;
  long lVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  __m128i tmp_len_minus_1;
  __m128i two;
  __m128i s0n_1;
  __m128i s0c_1;
  __m128i s1n_1;
  __m128i d1n_1;
  __m128i d1c_1;
  __m128i s0n_0;
  __m128i s0c_0;
  __m128i s1n_0;
  __m128i d1n_0;
  __m128i d1c_0;
  long local_700;
  OPJ_SIZE_T j;
  OPJ_INT32 i;
  OPJ_INT32 *in_odd;
  OPJ_INT32 *in_even;
  OPJ_SIZE_T stride_local;
  OPJ_INT32 *tiledp_col_local;
  OPJ_INT32 len_local;
  OPJ_INT32 sn_local;
  OPJ_INT32 *tmp_local;
  int local_658;
  int iStack_654;
  int iStack_650;
  int iStack_64c;
  int local_638;
  int iStack_634;
  int iStack_630;
  int iStack_62c;
  int local_618;
  int iStack_614;
  int iStack_610;
  int iStack_60c;
  int local_5f8;
  int iStack_5f4;
  int iStack_5f0;
  int iStack_5ec;
  int local_5d8;
  int iStack_5d4;
  int iStack_5d0;
  int iStack_5cc;
  int local_5b8;
  int iStack_5b4;
  int iStack_5b0;
  int iStack_5ac;
  int local_288;
  int iStack_284;
  int iStack_280;
  int iStack_27c;
  int local_278;
  int iStack_274;
  int iStack_270;
  int iStack_26c;
  int local_248;
  int iStack_244;
  int iStack_240;
  int iStack_23c;
  int local_238;
  int iStack_234;
  int iStack_230;
  int iStack_22c;
  int local_1f8;
  int iStack_1f4;
  int iStack_1f0;
  int iStack_1ec;
  int local_1b8;
  int iStack_1b4;
  int iStack_1b0;
  int iStack_1ac;
  
  plVar1 = (longlong *)(tiledp_col + (long)sn * stride);
  if (len < 2) {
    __assert_fail("len > 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/dwt.c"
                  ,0x291,
                  "void opj_idwt53_v_cas0_mcols_SSE2_OR_AVX2(OPJ_INT32 *, const OPJ_INT32, const OPJ_INT32, OPJ_INT32 *, const OPJ_SIZE_T)"
                 );
  }
  if (((ulong)tmp & 0xf) == 0) {
    s1n_0[1] = *plVar1;
    d1n_0[0] = plVar1[1];
    s1n_1[1] = plVar1[2];
    d1n_1[0] = plVar1[3];
    local_1b8 = (int)s1n_0[1];
    iStack_1b4 = (int)((ulong)s1n_0[1] >> 0x20);
    iStack_1b0 = (int)d1n_0[0];
    iStack_1ac = (int)((ulong)d1n_0[0] >> 0x20);
    auVar6 = ZEXT416(2);
    local_5b8 = (int)*(undefined8 *)tiledp_col;
    iStack_5b4 = (int)((ulong)*(undefined8 *)tiledp_col >> 0x20);
    iStack_5b0 = (int)*(undefined8 *)(tiledp_col + 2);
    iStack_5ac = (int)((ulong)*(undefined8 *)(tiledp_col + 2) >> 0x20);
    local_1f8 = (int)s1n_1[1];
    iStack_1f4 = (int)((ulong)s1n_1[1] >> 0x20);
    iStack_1f0 = (int)d1n_1[0];
    iStack_1ec = (int)((ulong)d1n_1[0] >> 0x20);
    auVar7 = ZEXT416(2);
    local_5d8 = (int)*(undefined8 *)(tiledp_col + 4);
    iStack_5d4 = (int)((ulong)*(undefined8 *)(tiledp_col + 4) >> 0x20);
    iStack_5d0 = (int)*(undefined8 *)(tiledp_col + 6);
    iStack_5cc = (int)((ulong)*(undefined8 *)(tiledp_col + 6) >> 0x20);
    local_700 = 1;
    two[1]._0_4_ = local_5d8 - (local_1f8 * 2 + 2 >> auVar7);
    two[1]._4_4_ = iStack_5d4 - (iStack_1f4 * 2 + 2 >> auVar7);
    s0n_1[0]._0_4_ = iStack_5d0 - (iStack_1f0 * 2 + 2 >> auVar7);
    s0n_1[0]._4_4_ = iStack_5cc - (iStack_1ec * 2 + 2 >> auVar7);
    d1c_1[1]._0_4_ = local_5b8 - (local_1b8 * 2 + 2 >> auVar6);
    d1c_1[1]._4_4_ = iStack_5b4 - (iStack_1b4 * 2 + 2 >> auVar6);
    s0n_0[0]._0_4_ = iStack_5b0 - (iStack_1b0 * 2 + 2 >> auVar6);
    s0n_0[0]._4_4_ = iStack_5ac - (iStack_1ac * 2 + 2 >> auVar6);
    for (j._4_4_ = 0; local_238 = (int)s1n_0[1], iStack_234 = (int)((ulong)s1n_0[1] >> 0x20),
        iStack_230 = (int)d1n_0[0], iStack_22c = (int)((ulong)d1n_0[0] >> 0x20),
        local_278 = (int)s1n_1[1], iStack_274 = (int)((ulong)s1n_1[1] >> 0x20),
        iStack_270 = (int)d1n_1[0], iStack_26c = (int)((ulong)d1n_1[0] >> 0x20), j._4_4_ < len + -3;
        j._4_4_ = j._4_4_ + 2) {
      uVar2 = *(undefined8 *)(tiledp_col + local_700 * stride);
      uVar3 = *(undefined8 *)(tiledp_col + local_700 * stride + 2);
      plVar4 = (longlong *)((long)plVar1 + local_700 * stride * 4);
      s1n_0[1] = *plVar4;
      d1n_0[0] = plVar4[1];
      s1n_1[1] = *(longlong *)((long)plVar1 + local_700 * stride * 4 + 0x10);
      d1n_1[0] = *(longlong *)((long)plVar1 + local_700 * stride * 4 + 0x18);
      local_248 = (int)s1n_0[1];
      iStack_244 = (int)((ulong)s1n_0[1] >> 0x20);
      iStack_240 = (int)d1n_0[0];
      iStack_23c = (int)((ulong)d1n_0[0] >> 0x20);
      auVar6 = ZEXT416(2);
      local_5f8 = (int)uVar2;
      iStack_5f4 = (int)((ulong)uVar2 >> 0x20);
      iStack_5f0 = (int)uVar3;
      iStack_5ec = (int)((ulong)uVar3 >> 0x20);
      local_5f8 = local_5f8 - (local_238 + local_248 + 2 >> auVar6);
      iStack_5f4 = iStack_5f4 - (iStack_234 + iStack_244 + 2 >> auVar6);
      iStack_5f0 = iStack_5f0 - (iStack_230 + iStack_240 + 2 >> auVar6);
      iStack_5ec = iStack_5ec - (iStack_22c + iStack_23c + 2 >> auVar6);
      local_288 = (int)s1n_1[1];
      iStack_284 = (int)((ulong)s1n_1[1] >> 0x20);
      iStack_280 = (int)d1n_1[0];
      iStack_27c = (int)((ulong)d1n_1[0] >> 0x20);
      auVar6 = ZEXT416(2);
      local_618 = (int)*(undefined8 *)(tiledp_col + local_700 * stride + 4);
      iStack_614 = (int)((ulong)*(undefined8 *)(tiledp_col + local_700 * stride + 4) >> 0x20);
      iStack_610 = (int)*(undefined8 *)(tiledp_col + local_700 * stride + 6);
      iStack_60c = (int)((ulong)*(undefined8 *)(tiledp_col + local_700 * stride + 6) >> 0x20);
      local_618 = local_618 - (local_278 + local_288 + 2 >> auVar6);
      iStack_614 = iStack_614 - (iStack_274 + iStack_284 + 2 >> auVar6);
      iStack_610 = iStack_610 - (iStack_270 + iStack_280 + 2 >> auVar6);
      iStack_60c = iStack_60c - (iStack_26c + iStack_27c + 2 >> auVar6);
      *(ulong *)(tmp + (j._4_4_ << 3)) = CONCAT44(d1c_1[1]._4_4_,(int)d1c_1[1]);
      *(ulong *)(tmp + (j._4_4_ << 3) + 2) = CONCAT44(s0n_0[0]._4_4_,(int)s0n_0[0]);
      *(ulong *)(tmp + (long)(j._4_4_ << 3) + 4) = CONCAT44(two[1]._4_4_,(int)two[1]);
      *(ulong *)(tmp + (long)(j._4_4_ << 3) + 6) = CONCAT44(s0n_1[0]._4_4_,(int)s0n_1[0]);
      auVar6 = ZEXT416(1);
      *(ulong *)(tmp + (j._4_4_ + 1) * 8) =
           CONCAT44(iStack_234 + (d1c_1[1]._4_4_ + iStack_5f4 >> auVar6),
                    local_238 + ((int)d1c_1[1] + local_5f8 >> auVar6));
      *(ulong *)(tmp + (j._4_4_ + 1) * 8 + 2) =
           CONCAT44(iStack_22c + (s0n_0[0]._4_4_ + iStack_5ec >> auVar6),
                    iStack_230 + ((int)s0n_0[0] + iStack_5f0 >> auVar6));
      auVar6 = ZEXT416(1);
      *(ulong *)(tmp + (long)((j._4_4_ + 1) * 8) + 4) =
           CONCAT44(iStack_274 + (two[1]._4_4_ + iStack_614 >> auVar6),
                    local_278 + ((int)two[1] + local_618 >> auVar6));
      *(ulong *)(tmp + (long)((j._4_4_ + 1) * 8) + 6) =
           CONCAT44(iStack_26c + (s0n_1[0]._4_4_ + iStack_60c >> auVar6),
                    iStack_270 + ((int)s0n_1[0] + iStack_610 >> auVar6));
      local_700 = local_700 + 1;
      two[1]._0_4_ = local_618;
      two[1]._4_4_ = iStack_614;
      s0n_1[0]._0_4_ = iStack_610;
      s0n_1[0]._4_4_ = iStack_60c;
      d1c_1[1]._0_4_ = local_5f8;
      d1c_1[1]._4_4_ = iStack_5f4;
      s0n_0[0]._0_4_ = iStack_5f0;
      s0n_0[0]._4_4_ = iStack_5ec;
    }
    *(ulong *)(tmp + (j._4_4_ << 3)) = CONCAT44(d1c_1[1]._4_4_,(int)d1c_1[1]);
    *(ulong *)(tmp + (j._4_4_ << 3) + 2) = CONCAT44(s0n_0[0]._4_4_,(int)s0n_0[0]);
    *(ulong *)(tmp + (long)(j._4_4_ << 3) + 4) = CONCAT44(two[1]._4_4_,(int)two[1]);
    *(ulong *)(tmp + (long)(j._4_4_ << 3) + 6) = CONCAT44(s0n_1[0]._4_4_,(int)s0n_1[0]);
    if ((len & 1U) == 0) {
      *(ulong *)(tmp + (len + -1) * 8) =
           CONCAT44(iStack_234 + d1c_1[1]._4_4_,local_238 + (int)d1c_1[1]);
      *(ulong *)(tmp + (len + -1) * 8 + 2) =
           CONCAT44(iStack_22c + s0n_0[0]._4_4_,iStack_230 + (int)s0n_0[0]);
      *(ulong *)(tmp + (long)((len + -1) * 8) + 4) =
           CONCAT44(iStack_274 + two[1]._4_4_,local_278 + (int)two[1]);
      *(ulong *)(tmp + (long)((len + -1) * 8) + 6) =
           CONCAT44(iStack_26c + s0n_1[0]._4_4_,iStack_270 + (int)s0n_1[0]);
    }
    else {
      uVar2 = *(undefined8 *)(tiledp_col + (long)((len + -1) / 2) * stride);
      uVar3 = *(undefined8 *)(tiledp_col + (long)((len + -1) / 2) * stride + 2);
      auVar6 = ZEXT416(2);
      local_638 = (int)uVar2;
      iStack_634 = (int)((ulong)uVar2 >> 0x20);
      iStack_630 = (int)uVar3;
      iStack_62c = (int)((ulong)uVar3 >> 0x20);
      local_638 = local_638 - (local_238 * 2 + 2 >> auVar6);
      iStack_634 = iStack_634 - (iStack_234 * 2 + 2 >> auVar6);
      iStack_630 = iStack_630 - (iStack_230 * 2 + 2 >> auVar6);
      iStack_62c = iStack_62c - (iStack_22c * 2 + 2 >> auVar6);
      *(ulong *)(tmp + (len + -1) * 8) = CONCAT44(iStack_634,local_638);
      *(ulong *)(tmp + (len + -1) * 8 + 2) = CONCAT44(iStack_62c,iStack_630);
      auVar6 = ZEXT416(1);
      *(ulong *)(tmp + (len + -2) * 8) =
           CONCAT44(iStack_234 + (d1c_1[1]._4_4_ + iStack_634 >> auVar6),
                    local_238 + ((int)d1c_1[1] + local_638 >> auVar6));
      *(ulong *)(tmp + (len + -2) * 8 + 2) =
           CONCAT44(iStack_22c + (s0n_0[0]._4_4_ + iStack_62c >> auVar6),
                    iStack_230 + ((int)s0n_0[0] + iStack_630 >> auVar6));
      lVar5 = (long)((len + -1) / 2) * stride;
      auVar6 = ZEXT416(2);
      local_658 = (int)*(undefined8 *)(tiledp_col + lVar5 + 4);
      iStack_654 = (int)((ulong)*(undefined8 *)(tiledp_col + lVar5 + 4) >> 0x20);
      iStack_650 = (int)*(undefined8 *)(tiledp_col + lVar5 + 6);
      iStack_64c = (int)((ulong)*(undefined8 *)(tiledp_col + lVar5 + 6) >> 0x20);
      local_658 = local_658 - (local_278 * 2 + 2 >> auVar6);
      iStack_654 = iStack_654 - (iStack_274 * 2 + 2 >> auVar6);
      iStack_650 = iStack_650 - (iStack_270 * 2 + 2 >> auVar6);
      iStack_64c = iStack_64c - (iStack_26c * 2 + 2 >> auVar6);
      *(ulong *)(tmp + (long)((len + -1) * 8) + 4) = CONCAT44(iStack_654,local_658);
      *(ulong *)(tmp + (long)((len + -1) * 8) + 6) = CONCAT44(iStack_64c,iStack_650);
      auVar6 = ZEXT416(1);
      *(ulong *)(tmp + (long)((len + -2) * 8) + 4) =
           CONCAT44(iStack_274 + (two[1]._4_4_ + iStack_654 >> auVar6),
                    local_278 + ((int)two[1] + local_658 >> auVar6));
      *(ulong *)(tmp + (long)((len + -2) * 8) + 6) =
           CONCAT44(iStack_26c + (s0n_1[0]._4_4_ + iStack_64c >> auVar6),
                    iStack_270 + ((int)s0n_1[0] + iStack_650 >> auVar6));
    }
    opj_idwt53_v_final_memcpy(tiledp_col,tmp,len,stride);
    return;
  }
  __assert_fail("(OPJ_SIZE_T)tmp % (sizeof(OPJ_INT32) * VREG_INT_COUNT) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/dwt.c"
                ,0x29d,
                "void opj_idwt53_v_cas0_mcols_SSE2_OR_AVX2(OPJ_INT32 *, const OPJ_INT32, const OPJ_INT32, OPJ_INT32 *, const OPJ_SIZE_T)"
               );
}

Assistant:

static void opj_idwt53_v_cas0_mcols_SSE2_OR_AVX2(
    OPJ_INT32* tmp,
    const OPJ_INT32 sn,
    const OPJ_INT32 len,
    OPJ_INT32* tiledp_col,
    const OPJ_SIZE_T stride)
{
    const OPJ_INT32* in_even = &tiledp_col[0];
    const OPJ_INT32* in_odd = &tiledp_col[(OPJ_SIZE_T)sn * stride];

    OPJ_INT32 i;
    OPJ_SIZE_T j;
    VREG d1c_0, d1n_0, s1n_0, s0c_0, s0n_0;
    VREG d1c_1, d1n_1, s1n_1, s0c_1, s0n_1;
    const VREG two = LOAD_CST(2);

    assert(len > 1);
#if __AVX2__
    assert(PARALLEL_COLS_53 == 16);
    assert(VREG_INT_COUNT == 8);
#else
    assert(PARALLEL_COLS_53 == 8);
    assert(VREG_INT_COUNT == 4);
#endif

    /* Note: loads of input even/odd values must be done in a unaligned */
    /* fashion. But stores in tmp can be done with aligned store, since */
    /* the temporary buffer is properly aligned */
    assert((OPJ_SIZE_T)tmp % (sizeof(OPJ_INT32) * VREG_INT_COUNT) == 0);

    s1n_0 = LOADU(in_even + 0);
    s1n_1 = LOADU(in_even + VREG_INT_COUNT);
    d1n_0 = LOADU(in_odd);
    d1n_1 = LOADU(in_odd + VREG_INT_COUNT);

    /* s0n = s1n - ((d1n + 1) >> 1); <==> */
    /* s0n = s1n - ((d1n + d1n + 2) >> 2); */
    s0n_0 = SUB(s1n_0, SAR(ADD3(d1n_0, d1n_0, two), 2));
    s0n_1 = SUB(s1n_1, SAR(ADD3(d1n_1, d1n_1, two), 2));

    for (i = 0, j = 1; i < (len - 3); i += 2, j++) {
        d1c_0 = d1n_0;
        s0c_0 = s0n_0;
        d1c_1 = d1n_1;
        s0c_1 = s0n_1;

        s1n_0 = LOADU(in_even + j * stride);
        s1n_1 = LOADU(in_even + j * stride + VREG_INT_COUNT);
        d1n_0 = LOADU(in_odd + j * stride);
        d1n_1 = LOADU(in_odd + j * stride + VREG_INT_COUNT);

        /*s0n = s1n - ((d1c + d1n + 2) >> 2);*/
        s0n_0 = SUB(s1n_0, SAR(ADD3(d1c_0, d1n_0, two), 2));
        s0n_1 = SUB(s1n_1, SAR(ADD3(d1c_1, d1n_1, two), 2));

        STORE(tmp + PARALLEL_COLS_53 * (i + 0), s0c_0);
        STORE(tmp + PARALLEL_COLS_53 * (i + 0) + VREG_INT_COUNT, s0c_1);

        /* d1c + ((s0c + s0n) >> 1) */
        STORE(tmp + PARALLEL_COLS_53 * (i + 1) + 0,
              ADD(d1c_0, SAR(ADD(s0c_0, s0n_0), 1)));
        STORE(tmp + PARALLEL_COLS_53 * (i + 1) + VREG_INT_COUNT,
              ADD(d1c_1, SAR(ADD(s0c_1, s0n_1), 1)));
    }

    STORE(tmp + PARALLEL_COLS_53 * (i + 0) + 0, s0n_0);
    STORE(tmp + PARALLEL_COLS_53 * (i + 0) + VREG_INT_COUNT, s0n_1);

    if (len & 1) {
        VREG tmp_len_minus_1;
        s1n_0 = LOADU(in_even + (OPJ_SIZE_T)((len - 1) / 2) * stride);
        /* tmp_len_minus_1 = s1n - ((d1n + 1) >> 1); */
        tmp_len_minus_1 = SUB(s1n_0, SAR(ADD3(d1n_0, d1n_0, two), 2));
        STORE(tmp + PARALLEL_COLS_53 * (len - 1), tmp_len_minus_1);
        /* d1n + ((s0n + tmp_len_minus_1) >> 1) */
        STORE(tmp + PARALLEL_COLS_53 * (len - 2),
              ADD(d1n_0, SAR(ADD(s0n_0, tmp_len_minus_1), 1)));

        s1n_1 = LOADU(in_even + (OPJ_SIZE_T)((len - 1) / 2) * stride + VREG_INT_COUNT);
        /* tmp_len_minus_1 = s1n - ((d1n + 1) >> 1); */
        tmp_len_minus_1 = SUB(s1n_1, SAR(ADD3(d1n_1, d1n_1, two), 2));
        STORE(tmp + PARALLEL_COLS_53 * (len - 1) + VREG_INT_COUNT,
              tmp_len_minus_1);
        /* d1n + ((s0n + tmp_len_minus_1) >> 1) */
        STORE(tmp + PARALLEL_COLS_53 * (len - 2) + VREG_INT_COUNT,
              ADD(d1n_1, SAR(ADD(s0n_1, tmp_len_minus_1), 1)));


    } else {
        STORE(tmp + PARALLEL_COLS_53 * (len - 1) + 0,
              ADD(d1n_0, s0n_0));
        STORE(tmp + PARALLEL_COLS_53 * (len - 1) + VREG_INT_COUNT,
              ADD(d1n_1, s0n_1));
    }

    opj_idwt53_v_final_memcpy(tiledp_col, tmp, len, stride);
}